

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O3

int FmsDomainSetNumEntities
              (FmsDomain domain,FmsEntityType type,FmsIntType id_store_type,FmsInt num_ents)

{
  size_t sVar1;
  FmsInt FVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  void *__ptr;
  FmsOrientation *__s;
  ulong uVar6;
  size_t __size;
  
  if (domain == (FmsDomain)0x0) {
    return 1;
  }
  if (FMS_PYRAMID < type) {
    return 2;
  }
  if (type == FMS_VERTEX) {
    domain->num_entities[0] = num_ents;
    if (domain->dim != 0x7f) {
      return 0;
    }
    domain->dim = 0;
    return 0;
  }
  if (FMS_INT_TYPE < id_store_type) {
    return 3;
  }
  sVar1 = FmsIntTypeSize[id_store_type];
  FVar2 = FmsEntityNumSides[type];
  domain->num_entities[type] = 0;
  domain->entities_caps[type] = 0;
  free(domain->orientations[type]);
  free(domain->entities[type]);
  if (num_ents == 0) {
    domain->entities[type] = (void *)0x0;
    domain->orientations[type] = (FmsOrientation *)0x0;
LAB_00105d3f:
    domain->entities_caps[type] = num_ents;
    domain->side_ids_type[type] = id_store_type;
    uVar3 = domain->dim;
    uVar4 = FmsEntityDim[type];
    uVar6 = uVar4;
    if (uVar4 < uVar3) {
      uVar6 = uVar3;
    }
    if (uVar3 == 0x7f) {
      uVar6 = uVar4;
    }
    domain->dim = uVar6;
    iVar5 = 0;
  }
  else {
    __size = FVar2 * num_ents;
    __ptr = malloc(sVar1 * __size);
    domain->entities[type] = __ptr;
    if (__ptr == (void *)0x0) {
      domain->orientations[type] = (FmsOrientation *)0x0;
    }
    else {
      __s = (FmsOrientation *)malloc(__size);
      domain->orientations[type] = __s;
      if (__s != (FmsOrientation *)0x0) {
        if (__size != 0) {
          memset(__s,0xff,__size);
        }
        goto LAB_00105d3f;
      }
      free(__ptr);
      domain->entities[type] = (void *)0x0;
    }
    iVar5 = 4;
  }
  return iVar5;
}

Assistant:

int FmsDomainSetNumEntities(FmsDomain domain, FmsEntityType type,
                            FmsIntType id_store_type, FmsInt num_ents) {
  if (!domain) { E_RETURN(1); }
  if (type >= FMS_NUM_ENTITY_TYPES) { E_RETURN(2); }
  if (type == FMS_VERTEX) {
    domain->num_entities[type] = num_ents;
    if (domain->dim == FMS_INVALID_DIM) { domain->dim = 0; }
    return 0;
  }
  if (id_store_type >= FMS_NUM_INT_TYPES) { E_RETURN(3); }
  const size_t sizeof_side_ids = FmsIntTypeSize[id_store_type];
  const FmsInt num_sides = FmsEntityNumSides[type];
  domain->num_entities[type] = 0;
  domain->entities_caps[type] = 0;
  free(domain->orientations[type]);
  free(domain->entities[type]);
  if (num_ents != 0) {
    FmsInt tot_sides = num_ents*num_sides;
    domain->entities[type] = malloc(tot_sides*sizeof_side_ids);
    if (domain->entities[type] == NULL) {
      domain->orientations[type] = NULL;
      E_RETURN(4);
    }
    domain->orientations[type] = malloc(tot_sides*sizeof(FmsOrientation));
    if (domain->orientations[type] == NULL) {
      free(domain->entities[type]);
      domain->entities[type] = NULL;
      E_RETURN(4);
    }
    FmsOrientation *orientations = domain->orientations[type];
    for (FmsInt i = 0; i < tot_sides; i++) {
      orientations[i] = FMS_ORIENTATION_UNKNOWN;
    }
  } else {
    domain->entities[type] = NULL;
    domain->orientations[type] = NULL;
  }
  domain->entities_caps[type] = num_ents;
  domain->side_ids_type[type] = id_store_type;
  if (domain->dim == FMS_INVALID_DIM) {
    domain->dim = FmsEntityDim[type];
  } else {
    domain->dim = FmsIntMax(domain->dim, FmsEntityDim[type]);
  }
  return 0;
}